

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O1

AST * parse_expression_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST *pAVar2;
  AST_Error *pAVar3;
  
  cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
  if (cVar1 != '\0') {
    pAVar2 = get_nop_tree();
    return pAVar2;
  }
  pAVar2 = parse_expression(translation_data,scope);
  cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
  if (cVar1 != '\0') {
    return pAVar2;
  }
  push_translation_error(" \';\' expected",translation_data);
  pAVar3 = get_error_tree(pAVar2);
  return (AST *)pAVar3;
}

Assistant:

struct AST* parse_expression_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST *hold;
	if(get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		hold=get_nop_tree();
		return (struct AST*)hold;
	}
	hold=parse_expression(translation_data,scope);
	if(get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		return hold;
	}else
	{
		push_translation_error(" ';' expected",translation_data);
		return (struct AST*)get_error_tree(hold);
	}
}